

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O0

mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
* fs_random_generator<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
            (void)

{
  array<unsigned_int,_1248UL> *__cont;
  iterator pvVar1;
  iterator __end;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_RDI;
  undefined1 local_2750 [8];
  seed_seq seed_seq;
  undefined1 local_2720 [8];
  random_device dev;
  array<unsigned_int,_1248UL> seed;
  unsigned_long seed_len;
  unsigned_long seed_bytes;
  
  __cont = (array<unsigned_int,_1248UL> *)((long)&dev.field_0 + 0x1380);
  memset(__cont,0,0x1380);
  std::random_device::random_device((random_device *)local_2720);
  pvVar1 = std::begin<std::array<unsigned_int,1248ul>>(__cont);
  seed_seq._M_v.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)std::ref<std::random_device>((random_device *)local_2720);
  std::generate_n<unsigned_int*,unsigned_long,std::reference_wrapper<std::random_device>>
            (pvVar1,0x4e0,
             (reference_wrapper<std::random_device>)
             seed_seq._M_v.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  pvVar1 = std::begin<std::array<unsigned_int,1248ul>>
                     ((array<unsigned_int,_1248UL> *)((long)&dev.field_0 + 0x1380));
  __end = std::end<std::array<unsigned_int,1248ul>>
                    ((array<unsigned_int,_1248UL> *)((long)&dev.field_0 + 0x1380));
  std::seed_seq::seed_seq<unsigned_int*>((seed_seq *)local_2750,pvVar1,__end);
  std::
  mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>
  ::mersenne_twister_engine<std::seed_seq,void>
            ((mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>
              *)in_RDI,(seed_seq *)local_2750);
  std::seed_seq::~seed_seq((seed_seq *)local_2750);
  std::random_device::~random_device((random_device *)local_2720);
  return in_RDI;
}

Assistant:

static auto fs_random_generator() -> T {
  auto constexpr seed_bytes = sizeof(typename T::result_type) * T::state_size;
  auto constexpr seed_len = seed_bytes / sizeof(std::seed_seq::result_type);
  auto seed = std::array<std::seed_seq::result_type, seed_len>();
  auto dev = std::random_device();
  std::generate_n(std::begin(seed), seed_len, std::ref(dev));
  auto seed_seq = std::seed_seq(std::begin(seed), std::end(seed));
  return T{seed_seq};
}